

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O3

int WebRtc_MoveReadPtr(RingBuffer *self,int element_count)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  if (self != (RingBuffer *)0x0) {
    uVar3 = (uint)self->element_count;
    iVar1 = (int)self->write_pos;
    iVar4 = (int)self->read_pos;
    if (self->rw_wrap == SAME_WRAP) {
      iVar5 = (iVar1 - iVar4) - uVar3;
      iVar2 = -iVar4;
    }
    else {
      iVar5 = iVar1 - iVar4;
      iVar2 = uVar3 - iVar4;
    }
    if (iVar1 + iVar2 < element_count) {
      element_count = iVar1 + iVar2;
    }
    if (element_count <= iVar5) {
      element_count = iVar5;
    }
    iVar4 = iVar4 + element_count;
    uVar6 = 0;
    if ((int)uVar3 < iVar4) {
      uVar6 = uVar3;
    }
    uVar6 = iVar4 - uVar6;
    if (((int)uVar3 < iVar4) || ((int)uVar6 < 0)) {
      self->rw_wrap = uVar6 >> 0x1f;
    }
    self->read_pos = (long)(int)(((int)uVar6 >> 0x1f & uVar3) + uVar6);
    return element_count;
  }
  return 0;
}

Assistant:

int WebRtc_MoveReadPtr(RingBuffer* self, int element_count) {
  if (!self) {
    return 0;
  }

  {
    // We need to be able to take care of negative changes, hence use "int"
    // instead of "size_t".
    const int free_elements = (int) WebRtc_available_write(self);
    const int readable_elements = (int) WebRtc_available_read(self);
    int read_pos = (int) self->read_pos;

    if (element_count > readable_elements) {
      element_count = readable_elements;
    }
    if (element_count < -free_elements) {
      element_count = -free_elements;
    }

    read_pos += element_count;
    if (read_pos > (int) self->element_count) {
      // Buffer wrap around. Restart read position and wrap indicator.
      read_pos -= (int) self->element_count;
      self->rw_wrap = SAME_WRAP;
    }
    if (read_pos < 0) {
      // Buffer wrap around. Restart read position and wrap indicator.
      read_pos += (int) self->element_count;
      self->rw_wrap = DIFF_WRAP;
    }

    self->read_pos = (size_t) read_pos;

    return element_count;
  }
}